

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_client_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  ptls_raw_extension_t *ppVar1;
  ptls_key_exchange_context_t **pppVar2;
  char cVar3;
  ptls_cipher_suite_t *ppVar4;
  st_ptls_get_time_t *psVar5;
  st_ptls_decompress_certificate_t *psVar6;
  st_ptls_on_extension_t *psVar7;
  ptls_buffer_t *buf;
  ptls_key_schedule_t *sched;
  size_t sVar8;
  size_t sVar9;
  ptls_key_exchange_context_t *ppVar10;
  ptls_aead_context_t *ctx;
  ptls_key_exchange_algorithm_t *ppVar11;
  st_ptls_save_ticket_t *psVar12;
  st_ptls_update_traffic_key_t *psVar13;
  ptls_iovec_t pVar14;
  ptls_iovec_t nonce;
  ptls_iovec_t ikm;
  st_ptls_signature_algorithms_t *psVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ushort *puVar19;
  byte bVar20;
  ushort uVar21;
  ushort uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined4 extraout_var;
  uint8_t *puVar26;
  uint64_t uVar27;
  uint8_t *puVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  ptls_key_exchange_algorithm_t **pppVar32;
  ptls_message_emitter_t *emitter_00;
  undefined1 *puVar33;
  ushort *puVar34;
  char *protocol;
  ptls_cipher_suite_t **pppVar35;
  undefined4 in_register_00000084;
  ptls_raw_extension_t *slots;
  ushort *puVar36;
  ushort *puVar37;
  ushort *puVar38;
  ulong uVar39;
  uint8_t *puVar40;
  ushort *puVar41;
  ptls_iovec_t pVar42;
  ptls_iovec_t context;
  ptls_iovec_t pVar43;
  ptls_iovec_t pVar44;
  ptls_iovec_t pVar45;
  ptls_iovec_t pVar46;
  ptls_iovec_t message_00;
  ptls_iovec_t pVar47;
  ptls_raw_extension_t *local_100;
  uint32_t ticket_lifetime;
  uint8_t *local_e0;
  st_ptls_signature_algorithms_t *local_d8;
  ulong local_d0;
  ptls_iovec_t ticket_nonce;
  void *local_b8;
  uint32_t max_early_data_size;
  undefined8 local_a8;
  ushort *local_a0;
  st_ptls_server_hello_t sh;
  uint32_t ticket_age_add;
  uint8_t uStack_34;
  uint8_t uStack_33;
  uint8_t uStack_32;
  uint8_t uStack_31;
  
  slots = (ptls_raw_extension_t *)CONCAT44(in_register_00000084,is_end_of_record);
  puVar28 = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  uVar30 = tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
  if (0xd < uVar30) {
switchD_0010b3b1_caseD_8:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x11da,
                  "int handle_client_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar3 = *(char *)&emitter_00->buf;
  message_00.len =
       (long)&switchD_0010b3b1::switchdataD_0012e990 +
       (long)(int)(&switchD_0010b3b1::switchdataD_0012e990)[uVar30];
  iVar23 = 10;
  switch(tls->state) {
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
  case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
    if (is_end_of_record == 0 || cVar3 != '\x02') {
      return 10;
    }
    ticket_nonce.base._0_1_ = 0;
    ticket_nonce.base._1_7_ = 0;
    ticket_nonce.len = 0;
    sh.random_[0] = '\0';
    sh.random_[1] = '\0';
    sh.random_[2] = '\0';
    sh.random_[3] = '\0';
    sh.random_[4] = '\0';
    sh.random_[5] = '\0';
    sh.random_[6] = '\0';
    sh.random_[7] = '\0';
    sh.random_[8] = '\0';
    sh.random_[9] = '\0';
    sh.random_[10] = '\0';
    sh.random_[0xb] = '\0';
    sh.random_[0xc] = '\0';
    sh.random_[0xd] = '\0';
    sh.random_[0xe] = '\0';
    sh.random_[0xf] = '\0';
    sh.random_[0x10] = '\0';
    sh.random_[0x11] = '\0';
    sh.random_[0x12] = '\0';
    sh.random_[0x13] = '\0';
    sh.random_[0x14] = '\0';
    sh.random_[0x15] = '\0';
    sh.random_[0x16] = '\0';
    sh.random_[0x17] = '\0';
    sh.random_[0x18] = '\0';
    sh.random_[0x19] = '\0';
    sh.random_[0x1a] = '\0';
    sh.random_[0x1b] = '\0';
    sh.random_[0x1c] = '\0';
    sh.random_[0x1d] = '\0';
    sh.random_[0x1e] = '\0';
    sh.random_[0x1f] = '\0';
    sh.legacy_session_id.base = (uint8_t *)0x0;
    sh.legacy_session_id.len = 0;
    sh.is_retry_request = 0;
    sh._52_4_ = 0;
    sh.field_3.peerkey.base = (uint8_t *)0x0;
    sh.field_3.peerkey.len = 0;
    sh.field_3.retry_request.cookie.len = 0;
    iVar23 = 0x32;
    if (0x25 < (long)puVar28) {
      iVar24 = bcmp((void *)((long)&emitter_00->buf + 6),hello_retry_random,0x20);
      sh.is_retry_request = (uint)(iVar24 == 0);
      if ((puVar28 != (uint8_t *)0x26) &&
         (puVar26 = (uint8_t *)(ulong)*(byte *)((long)&emitter_00->commit_message + 6),
         puVar26 <= puVar28 + -0x27 && puVar26 < (uint8_t *)0x21)) {
        puVar37 = (ushort *)((long)&emitter_00->buf + (long)puVar28);
        sh.legacy_session_id.base = (uint8_t *)((long)&emitter_00->commit_message + 7);
        puVar40 = (uint8_t *)((long)&emitter_00->buf + (long)puVar26);
        local_e0 = puVar28;
        sh.legacy_session_id.len = (size_t)puVar26;
        if (1 < (long)puVar37 - (long)(puVar40 + 0x27)) {
          uVar21 = *(ushort *)(puVar40 + 0x27);
          pppVar35 = tls->ctx->cipher_suites;
          do {
            ppVar4 = *pppVar35;
            if (ppVar4 == (ptls_cipher_suite_t *)0x0) {
              tls->cipher_suite = (ptls_cipher_suite_t *)0x0;
              iVar23 = 0x2f;
              goto LAB_0010bfd6;
            }
            pppVar35 = pppVar35 + 1;
          } while (ppVar4->id != (uint16_t)(uVar21 << 8 | uVar21 >> 8));
          tls->cipher_suite = ppVar4;
          iVar23 = 0x2f;
          if (((ushort *)(puVar40 + 0x29) != puVar37) && (puVar40[0x29] == '\0')) {
            if (iVar24 == 0) {
              sh.field_3.retry_request.selected_group = 0xffff;
            }
            ticket_age_add._0_1_ = '!';
            ticket_age_add._1_1_ = '$';
            ticket_age_add._2_1_ = '\x11';
            ticket_age_add._3_1_ = '\0';
            uStack_34 = '\0';
            uStack_33 = '$';
            uStack_32 = '\0';
            uStack_31 = '\0';
            iVar23 = 0x32;
            if (1 < (ulong)((long)puVar37 - (long)(puVar40 + 0x2a))) {
              uVar39 = (ulong)(ushort)(*(ushort *)(puVar40 + 0x2a) << 8 |
                                      *(ushort *)(puVar40 + 0x2a) >> 8);
              _ticket_lifetime = (ushort *)(puVar40 + 0x2c);
              if (uVar39 <= (ulong)((long)puVar37 - (long)_ticket_lifetime)) {
                puVar41 = (ushort *)(uVar39 + (long)_ticket_lifetime);
                local_a8 = CONCAT62(local_a8._2_6_,0xffff);
                local_b8._0_2_ = 0xffff;
                local_d0 = 0x32;
                puVar34 = _ticket_lifetime;
                while (iVar23 = 0x32, puVar34 != puVar41) {
                  if ((long)puVar41 - (long)puVar34 < 2) goto LAB_0010bfd6;
                  uVar21 = *puVar34 << 8 | *puVar34 >> 8;
                  local_a0 = (ushort *)CONCAT62(local_a0._2_6_,uVar21);
                  puVar36 = puVar34 + 1;
                  _ticket_lifetime = puVar36;
                  if ((uVar21 < 0x40) &&
                     ((*(byte *)((long)&ticket_age_add + (ulong)(uVar21 >> 3)) >> (uVar21 & 7) & 1)
                      != 0)) {
LAB_0010c479:
                    iVar23 = 0x2f;
                    goto LAB_0010bfd6;
                  }
                  local_d8 = (st_ptls_signature_algorithms_t *)CONCAT44(local_d8._4_4_,(uint)uVar21)
                  ;
                  extension_bitmap_set((st_ptls_extension_bitmap_t *)&ticket_age_add,uVar21);
                  if ((ulong)((long)puVar41 - (long)puVar36) < 2) {
LAB_0010c46b:
                    iVar23 = 0x32;
                    goto LAB_0010bfd6;
                  }
                  uVar21 = puVar34[1] << 8 | puVar34[1] >> 8;
                  puVar36 = puVar34 + 2;
                  _ticket_lifetime = puVar36;
                  if ((ulong)((long)puVar41 - (long)puVar36) < (ulong)uVar21) goto LAB_0010c46b;
                  psVar7 = tls->ctx->on_extension;
                  if ((psVar7 != (st_ptls_on_extension_t *)0x0) &&
                     (pVar44.len._0_2_ = uVar21, pVar44.base = (uint8_t *)puVar36,
                     pVar44.len._2_6_ = 0,
                     iVar23 = (*psVar7->cb)(psVar7,tls,'\x02',(uint16_t)local_d8,pVar44),
                     iVar23 != 0)) {
                    iVar23 = 1;
                    goto LAB_0010bfd6;
                  }
                  puVar36 = (ushort *)((long)puVar36 + (ulong)uVar21);
                  if ((short)local_a0 == 0x29) {
                    if (sh.is_retry_request != 0) goto LAB_0010c479;
                    if (1 < uVar21) {
                      local_b8._0_2_ = puVar34[2] << 8 | puVar34[2] >> 8;
LAB_0010b734:
                      puVar38 = puVar34 + 3;
                      puVar19 = puVar34 + 3;
                      goto LAB_0010b74b;
                    }
                    goto LAB_0010c46b;
                  }
                  if ((int)local_d8 == 0x33) {
                    if (sh.is_retry_request != 0) {
                      if (1 < uVar21) {
                        sh.field_3.retry_request.selected_group = puVar34[2] << 8 | puVar34[2] >> 8;
                        goto LAB_0010b734;
                      }
                      goto LAB_0010c46b;
                    }
                    iVar23 = decode_key_share_entry
                                       ((uint16_t *)&max_early_data_size,&sh.field_3.peerkey,
                                        (uint8_t **)&ticket_lifetime,(uint8_t *)puVar36);
                    uVar39 = CONCAT44(extraout_var,iVar23);
                    if ((iVar23 == 0) && (uVar39 = local_d0, _ticket_lifetime == puVar36)) {
                      if ((tls->key_share != (ptls_key_exchange_algorithm_t *)0x0) &&
                         (puVar38 = _ticket_lifetime, puVar19 = _ticket_lifetime,
                         tls->key_share->id == (ushort)max_early_data_size)) goto LAB_0010b74b;
                      uVar39 = 0x2f;
                    }
                    local_d0 = uVar39;
                    iVar23 = (int)local_d0;
                    goto LAB_0010bfd6;
                  }
                  puVar38 = puVar36;
                  if ((int)local_d8 == 0x2c) {
                    if (sh.is_retry_request == 0) goto LAB_0010c479;
                    if (uVar21 < 2) goto LAB_0010c46b;
                    uVar39 = (ulong)(ushort)(puVar34[2] << 8 | puVar34[2] >> 8);
                    puVar34 = puVar34 + 3;
                    iVar23 = 0x32;
                    if ((uVar39 - 1 < (ulong)((long)puVar36 - (long)puVar34)) &&
                       (_ticket_lifetime = (ushort *)((long)puVar34 + uVar39),
                       puVar19 = _ticket_lifetime,
                       sh.field_3.retry_request.cookie.base = (uint8_t *)puVar34,
                       sh.field_3.retry_request.cookie.len = uVar39, _ticket_lifetime == puVar36))
                    goto LAB_0010b74b;
                    goto LAB_0010bfd6;
                  }
                  puVar19 = puVar36;
                  if ((int)local_d8 == 0x2b) {
                    if (1 < uVar21) {
                      local_a8 = CONCAT62(local_a8._2_6_,puVar34[2] << 8 | puVar34[2] >> 8);
                      goto LAB_0010b734;
                    }
                    goto LAB_0010c46b;
                  }
LAB_0010b74b:
                  _ticket_lifetime = puVar19;
                  iVar23 = 0x32;
                  puVar34 = puVar38;
                  if (puVar38 != puVar36) goto LAB_0010bfd6;
                }
                if (puVar41 != puVar37) goto LAB_0010c46b;
                iVar24 = is_supported_version((uint16_t)local_a8);
                iVar23 = 0x2f;
                if (iVar24 == 0) goto LAB_0010bfd6;
                iVar24 = sh.is_retry_request;
                if (sh.is_retry_request == 0) {
                  if ((ushort)local_b8 != 0xffff) {
                    if (((ushort)local_b8 != 0) ||
                       (((tls->field_18).server.pending_traffic_secret[0x38] & 1) == 0))
                    goto LAB_0010bfd6;
                    tls->field_0x160 = tls->field_0x160 | 2;
                  }
                  if ((sh.field_3.peerkey.base == (uint8_t *)0x0) && ((tls->field_0x160 & 2) == 0))
                  goto LAB_0010bfd6;
                }
                iVar23 = 0x2f;
                if ((sh.legacy_session_id.len == (tls->field_18).client.legacy_session_id.len) &&
                   (iVar25 = (*ptls_mem_equal)(sh.legacy_session_id.base,
                                               (tls->field_18).client.legacy_session_id.base,
                                               sh.legacy_session_id.len), iVar25 != 0)) {
                  uVar30 = 0;
                  if (iVar24 == 0) {
                    if (((tls->field_18).server.pending_traffic_secret[0x38] & 1) != 0) {
                      uVar30 = (uint)((tls->field_0x160 & 2) == 0);
                    }
                    iVar23 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,uVar30);
                    if ((iVar23 == 0) &&
                       ((sh.field_3.peerkey.base == (uint8_t *)0x0 ||
                        (pVar43.len = sh.field_3.peerkey.len, pVar43.base = sh.field_3.peerkey.base,
                        iVar23 = (*((tls->field_18).client.key_share_ctx)->on_exchange)
                                           (&(tls->field_18).client.key_share_ctx,1,&ticket_nonce,
                                            pVar43), iVar23 == 0)))) {
                      ptls__key_schedule_update_hash
                                (tls->key_schedule,(uint8_t *)emitter_00,(size_t)local_e0);
                      ikm.base._1_7_ = ticket_nonce.base._1_7_;
                      ikm.base._0_1_ = ticket_nonce.base._0_1_;
                      ikm.len = ticket_nonce.len;
                      iVar23 = key_schedule_extract(tls->key_schedule,ikm);
                      if ((iVar23 == 0) &&
                         (iVar23 = setup_traffic_protection(tls,0,"s hs traffic",2,0), iVar23 == 0))
                      {
                        if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
                          iVar23 = setup_traffic_protection(tls,1,"c hs traffic",2,0);
LAB_0010c8a2:
                          if (iVar23 == 0) {
LAB_0010c8aa:
                            tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
                            iVar23 = 0x202;
                          }
                        }
                        else {
                          puVar28 = (uint8_t *)malloc(0x40);
                          tls->pending_handshake_secret = puVar28;
                          if (puVar28 == (uint8_t *)0x0) {
                            iVar23 = 0x201;
                          }
                          else {
                            iVar23 = derive_secret(tls->key_schedule,puVar28,"c hs traffic");
                            if (iVar23 == 0) {
                              psVar13 = tls->ctx->update_traffic_key;
                              if (psVar13 != (st_ptls_update_traffic_key_t *)0x0) {
                                iVar23 = (*psVar13->cb)(psVar13,tls,1,2,
                                                        tls->pending_handshake_secret);
                                goto LAB_0010c8a2;
                              }
                              goto LAB_0010c8aa;
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    iVar23 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,0);
                    if (iVar23 == 0) {
                      ppVar10 = (tls->field_18).client.key_share_ctx;
                      if (ppVar10 != (ptls_key_exchange_context_t *)0x0) {
                        pppVar2 = &(tls->field_18).client.key_share_ctx;
                        (*ppVar10->on_exchange)
                                  (pppVar2,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
                        *pppVar2 = (ptls_key_exchange_context_t *)0x0;
                      }
                      bVar20 = (tls->field_18).server.pending_traffic_secret[0x38];
                      if ((bVar20 & 2) != 0) {
                        if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
                          ctx = (tls->traffic_protection).enc.aead;
                          if (ctx == (ptls_aead_context_t *)0x0) {
                            __assert_fail("tls->traffic_protection.enc.aead != NULL",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                          ,0x912,
                                          "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                         );
                          }
                          ptls_aead_free(ctx);
                          (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
                          bVar20 = (tls->field_18).server.pending_traffic_secret[0x38];
                        }
                        (tls->field_18).server.pending_traffic_secret[0x38] = bVar20 & 0xfd;
                      }
                      if (sh.field_3.retry_request.selected_group == 0xffff) {
                        if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                          return 0x2f;
                        }
                      }
                      else {
                        pppVar32 = tls->ctx->key_exchanges;
                        do {
                          ppVar11 = *pppVar32;
                          if (ppVar11 == (ptls_key_exchange_algorithm_t *)0x0) {
                            return 0x2f;
                          }
                          pppVar32 = pppVar32 + 1;
                        } while (ppVar11->id != sh.field_3.retry_request.selected_group);
                        tls->key_share = ppVar11;
                      }
                      key_schedule_transform_post_ch1hash(tls->key_schedule);
                      ptls__key_schedule_update_hash
                                (tls->key_schedule,(uint8_t *)emitter_00,(size_t)local_e0);
                      iVar23 = send_client_hello(tls,emitter,properties,
                                                 &sh.field_3.retry_request.cookie);
                      return iVar23;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0010bfd6:
    if ((void *)CONCAT71(ticket_nonce.base._1_7_,ticket_nonce.base._0_1_) == (void *)0x0) {
      return iVar23;
    }
    (*ptls_clear_memory)
              ((void *)CONCAT71(ticket_nonce.base._1_7_,ticket_nonce.base._0_1_),ticket_nonce.len);
    local_100 = (ptls_raw_extension_t *)CONCAT71(ticket_nonce.base._1_7_,ticket_nonce.base._0_1_);
    goto LAB_0010bff7;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (cVar3 == '\b') {
      sh.random_[0] = ' ';
      sh.random_[1] = ' ';
      sh.random_[2] = '\0';
      sh.random_[3] = '\0';
      sh.random_[4] = '\0';
      sh.random_[5] = ':';
      sh.random_[6] = '\b';
      sh.random_[7] = '\0';
      if ((((ulong)puVar28 & 0xfffffffffffffffe) != 4) &&
         (uVar21 = *(ushort *)((long)&emitter_00->buf + 4),
         puVar26 = (uint8_t *)(ulong)(ushort)(uVar21 << 8 | uVar21 >> 8), puVar26 <= puVar28 + -6))
      {
        local_d8 = (st_ptls_signature_algorithms_t *)(puVar26 + (long)emitter_00 + 6);
        local_a8 = 0;
        local_d0 = CONCAT44(local_d0._4_4_,1);
        local_100 = (ptls_raw_extension_t *)client_handle_encrypted_extensions_no_unknown_extensions
        ;
        local_b8 = (void *)0x0;
        puVar37 = (ushort *)((long)&emitter_00->buf + 6);
        local_e0 = puVar28;
LAB_0010bc1c:
        psVar15 = local_d8;
        if ((st_ptls_signature_algorithms_t *)puVar37 == local_d8) {
          if (local_d8 == (st_ptls_signature_algorithms_t *)((long)&emitter_00->buf + (long)puVar28)
             ) {
            if ((byte)local_a8 != ((byte)tls->ctx->field_0x70 >> 4 & 2)) {
              iVar23 = 0x2b;
              goto LAB_0010c1fd;
            }
            if (tls->esni == (ptls_esni_secret_t *)0x0) {
              if (local_b8 != (void *)0x0) {
                iVar23 = 0x2f;
                goto LAB_0010c1fd;
              }
            }
            else {
              iVar23 = 0x2f;
              if ((local_b8 == (void *)0x0) ||
                 (iVar24 = (*ptls_mem_equal)(local_b8,tls->esni->nonce,0x10), iVar24 == 0))
              goto LAB_0010c1fd;
              free_esni_secret(&tls->esni,0);
            }
            bVar20 = (tls->field_18).server.pending_traffic_secret[0x38];
            if ((bVar20 & 2) != 0) {
              if ((int)local_d0 != 0) {
                (tls->field_18).server.pending_traffic_secret[0x38] = bVar20 & 0xfd;
              }
              if (properties != (ptls_handshake_properties_t *)0x0) {
                (properties->field_0).client.early_data_acceptance =
                     ((int)local_d0 == 0) + PTLS_EARLY_DATA_REJECTED;
              }
            }
            iVar23 = report_unknown_extensions(tls,properties,local_100);
            if (iVar23 == 0) {
              ptls__key_schedule_update_hash
                        (tls->key_schedule,(uint8_t *)emitter_00,(size_t)local_e0);
              bVar20 = (tls->field_0x160 & 2) >> 1;
              tls->state = (uint)bVar20 + (uint)bVar20 * 2 +
                           PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
              iVar23 = 0x202;
            }
            goto LAB_0010c1fd;
          }
        }
        else {
          if ((long)local_d8 - (long)puVar37 < 2) goto LAB_0010c188;
          uVar21 = *puVar37 << 8 | *puVar37 >> 8;
          uVar30 = (uint)uVar21;
          if ((uVar21 < 0x40) && ((sh.random_[uVar21 >> 3] >> (uVar30 & 7) & 1) != 0))
          goto LAB_0010c17a;
          extension_bitmap_set((st_ptls_extension_bitmap_t *)&sh,uVar21);
          if ((ulong)((long)psVar15 - (long)(puVar37 + 1)) < 2) goto LAB_0010c188;
          uVar22 = puVar37[1] << 8 | puVar37[1] >> 8;
          uVar39 = (ulong)uVar22;
          ppVar1 = (ptls_raw_extension_t *)(puVar37 + 2);
          if ((ulong)((long)psVar15 - (long)ppVar1) < uVar39) goto LAB_0010c188;
          psVar7 = tls->ctx->on_extension;
          if ((psVar7 != (st_ptls_on_extension_t *)0x0) &&
             (pVar45.len._0_2_ = uVar22, pVar45.base = (uint8_t *)ppVar1, pVar45.len._2_6_ = 0,
             slots = ppVar1, iVar23 = (*psVar7->cb)(psVar7,tls,'\b',uVar21,pVar45), iVar23 != 0)) {
            iVar23 = 1;
            goto LAB_0010c1fd;
          }
          puVar34 = (ushort *)((long)puVar37 + 3 + uVar39 + 1);
          if (uVar21 == 0) {
            if (uVar39 != 0) goto LAB_0010c188;
            if ((tls->server_name == (char *)0x0) ||
               (iVar23 = ptls_server_name_is_ipaddr(tls->server_name), puVar37 = puVar34,
               iVar23 != 0)) goto LAB_0010c17a;
            goto LAB_0010bc1c;
          }
          if (uVar30 == 0x10) {
            if (1 < uVar22) {
              uVar39 = (ulong)(ushort)(puVar37[2] << 8 | puVar37[2] >> 8);
              iVar23 = 0x32;
              if (((ulong)((long)puVar34 - (long)(puVar37 + 3)) < uVar39) || (uVar39 == 0))
              goto LAB_0010c1fd;
              puVar41 = (ushort *)((long)(puVar37 + 3) + uVar39);
              uVar39 = (ulong)(byte)puVar37[3];
              protocol = (char *)((long)puVar37 + 7);
              if (((ulong)((long)puVar41 - (long)protocol) < uVar39) ||
                 ((uVar39 == 0 ||
                  (iVar23 = ptls_set_negotiated_protocol(tls,protocol,uVar39), iVar23 != 0))))
              goto LAB_0010c1fd;
              if ((ushort *)(protocol + uVar39) != puVar41) {
                iVar23 = 0x28;
                goto LAB_0010c1fd;
              }
              puVar37 = puVar34;
              if (puVar41 != puVar34) goto LAB_0010c188;
              goto LAB_0010bc1c;
            }
          }
          else {
            if (uVar30 != 0x14) {
              if (uVar30 == 0x2a) {
                local_d0 = local_d0 & 0xffffffff00000000;
                puVar37 = puVar34;
                if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0)
                goto LAB_0010c17a;
              }
              else if (uVar30 == 0xffce) {
                if ((char)ppVar1->type != '\0') {
                  iVar23 = 0x208;
                  goto LAB_0010c1fd;
                }
                if (uVar22 != 0x11) goto LAB_0010c17a;
                local_b8 = (void *)((long)puVar37 + 5);
                puVar37 = puVar34;
              }
              else {
                local_a0 = puVar34;
                iVar23 = should_collect_unknown_extension(tls,properties,uVar21);
                puVar37 = local_a0;
                if (iVar23 != 0) {
                  if (local_100 ==
                      (ptls_raw_extension_t *)
                      client_handle_encrypted_extensions_no_unknown_extensions) {
                    local_100 = (ptls_raw_extension_t *)malloc(0x198);
                    if (local_100 == (ptls_raw_extension_t *)0x0) {
                      iVar23 = 0x201;
                      local_100 = (ptls_raw_extension_t *)0x0;
                      goto LAB_0010c1fd;
                    }
                    local_100->type = 0xffff;
                  }
                  iVar23 = collect_unknown_extension
                                     ((ptls_t *)(ulong)uVar30,(uint16_t)ppVar1,(uint8_t *)local_a0,
                                      (uint8_t *)local_100,slots);
                  puVar37 = local_a0;
                  if (iVar23 != 0) goto LAB_0010c1fd;
                }
              }
              goto LAB_0010bc1c;
            }
            if (uVar22 == 1) {
              local_a8 = CONCAT71((int7)((ulong)((long)puVar37 + 3) >> 8),(char)ppVar1->type);
              puVar37 = puVar34;
              goto LAB_0010bc1c;
            }
          }
        }
LAB_0010c188:
        iVar23 = 0x32;
        goto LAB_0010c1fd;
      }
      iVar23 = 0x32;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
    if (cVar3 == '\v') {
LAB_0010bb5c:
      iVar23 = client_do_handle_certificate
                         (tls,(uint8_t *)((long)&emitter_00->buf + 4),
                          (uint8_t *)((long)&emitter_00->buf + (long)puVar28));
      if (iVar23 != 0) {
        return iVar23;
      }
      ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar28);
      tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    }
    else {
      if (cVar3 == '\x19') goto LAB_0010bb12;
      if (cVar3 != '\r') {
        return 10;
      }
      if (puVar28 == (uint8_t *)0x4) {
        return 0x32;
      }
      puVar26 = (uint8_t *)(ulong)*(byte *)((long)&emitter_00->buf + 4);
      if (puVar28 + -5 < puVar26) {
        return 0x32;
      }
      puVar34 = (ushort *)((long)&emitter_00->buf + 5);
      puVar37 = (ushort *)((long)puVar34 + (long)puVar26);
      puVar40 = (uint8_t *)0x1;
      if (puVar26 != (uint8_t *)0x0) {
        puVar40 = puVar26;
      }
      local_e0 = puVar28;
      puVar28 = (uint8_t *)malloc((size_t)puVar40);
      (tls->field_18).client.certificate_request.context.base = puVar28;
      if (puVar28 == (uint8_t *)0x0) {
        iVar23 = 0x201;
      }
      else {
        (tls->field_18).client.certificate_request.context.len = (size_t)puVar26;
        memcpy(puVar28,puVar34,(size_t)puVar26);
        iVar23 = 0x32;
        puVar34 = puVar37;
      }
      iVar24 = 0x32;
      if (puVar34 == puVar37) {
        iVar24 = iVar23;
      }
      if (puVar28 == (uint8_t *)0x0) {
        return iVar23;
      }
      if (puVar34 != puVar37) {
        return iVar24;
      }
      puVar34 = (ushort *)((long)&emitter_00->buf + (long)local_e0);
      ticket_nonce.base._0_1_ = 1;
      ticket_nonce.base._1_7_ = 0x83e00001104;
      if ((ulong)((long)puVar34 - (long)puVar37) < 2) {
        return 0x32;
      }
      uVar39 = (ulong)(ushort)(*puVar37 << 8 | *puVar37 >> 8);
      puVar37 = puVar37 + 1;
      if ((ulong)((long)puVar34 - (long)puVar37) < uVar39) {
        return 0x32;
      }
      puVar41 = (ushort *)(uVar39 + (long)puVar37);
      local_d8 = &(tls->field_18).client.certificate_request.signature_algorithms;
      while (puVar37 != puVar41) {
        if ((long)puVar41 - (long)puVar37 < 2) {
          return 0x32;
        }
        uVar21 = *puVar37 << 8 | *puVar37 >> 8;
        if ((uVar21 < 0x40) &&
           ((*(byte *)((long)&ticket_nonce.base + (ulong)(uVar21 >> 3)) >> (uVar21 & 7) & 1) != 0))
        {
          return 0x2f;
        }
        extension_bitmap_set((st_ptls_extension_bitmap_t *)&ticket_nonce,uVar21);
        if ((ulong)((long)puVar41 - (long)(puVar37 + 1)) < 2) {
          return 0x32;
        }
        uVar22 = puVar37[1] << 8 | puVar37[1] >> 8;
        puVar37 = puVar37 + 2;
        if ((ulong)((long)puVar41 - (long)puVar37) < (ulong)uVar22) {
          return 0x32;
        }
        psVar7 = tls->ctx->on_extension;
        sh.random_._0_8_ = puVar37;
        if ((psVar7 != (st_ptls_on_extension_t *)0x0) &&
           (pVar46.len._0_2_ = uVar22, pVar46.base = (uint8_t *)puVar37, pVar46.len._2_6_ = 0,
           iVar23 = (*psVar7->cb)(psVar7,tls,'\r',uVar21,pVar46), iVar23 != 0)) {
          return 1;
        }
        puVar37 = (ushort *)((long)puVar37 + (ulong)uVar22);
        if ((uVar21 == 0xd) &&
           (iVar23 = decode_signature_algorithms(local_d8,(uint8_t **)&sh,(uint8_t *)puVar37),
           iVar23 != 0)) {
          return iVar23;
        }
        sh.random_._0_8_ = puVar37;
      }
      if (puVar41 != puVar34) {
        return 0x32;
      }
      if ((tls->field_18).client.certificate_request.signature_algorithms.count == 0) {
        return 0x6d;
      }
      if ((tls->field_18).client.certificate_request.context.len != 0) {
        return 0x2f;
      }
      tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
      ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)local_e0);
    }
    goto LAB_0010bbbd;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (cVar3 != '\x19') {
      if (cVar3 != '\v') {
        return 10;
      }
      goto LAB_0010bb5c;
    }
LAB_0010bb12:
    if (tls->ctx->decompress_certificate == (ptls_decompress_certificate_t *)0x0) {
      iVar23 = 10;
    }
    else {
      iVar24 = 0x32;
      iVar23 = iVar24;
      if (5 < (long)puVar28) {
        puVar26 = (uint8_t *)((long)&emitter_00->buf + (long)puVar28);
        uVar21 = *(ushort *)((long)&emitter_00->buf + 4);
        puVar33 = (undefined1 *)((long)&emitter_00->buf + 6);
        ticket_nonce.base._0_1_ = SUB81(puVar33,0);
        ticket_nonce.base._1_7_ = (undefined7)((ulong)puVar33 >> 8);
        iVar23 = ptls_decode24(&ticket_lifetime,&ticket_nonce.base,puVar26);
        if (iVar23 == 0) {
          puVar37 = (ushort *)((ulong)_ticket_lifetime & 0xffffffff);
          if (puVar37 < (ushort *)0x10001) {
            local_d8 = (st_ptls_signature_algorithms_t *)puVar37;
            local_100 = (ptls_raw_extension_t *)malloc((size_t)puVar37);
            if (local_100 == (ptls_raw_extension_t *)0x0) {
              iVar23 = 0x201;
              goto LAB_0010bb9c;
            }
            lVar31 = CONCAT71(ticket_nonce.base._1_7_,ticket_nonce.base._0_1_);
            iVar23 = iVar24;
            if (2 < (ulong)((long)puVar26 - lVar31)) {
              lVar29 = 0;
              uVar39 = 0;
              do {
                uVar39 = (ulong)*(byte *)(lVar31 + lVar29) | uVar39 << 8;
                lVar29 = lVar29 + 1;
              } while (lVar29 != 3);
              puVar40 = (uint8_t *)(lVar31 + 3);
              local_e0 = puVar28;
              if ((((uVar39 <= (ulong)((long)puVar26 - (long)puVar40)) &&
                   (psVar6 = tls->ctx->decompress_certificate, pVar14.len = uVar39,
                   pVar14.base = puVar40, pVar42.len = (size_t)local_d8,
                   pVar42.base = (uint8_t *)local_100, sh.random_._0_8_ = puVar40,
                   sh.random_._8_8_ = uVar39,
                   iVar23 = (*psVar6->cb)(psVar6,tls,uVar21 << 8 | uVar21 >> 8,pVar42,pVar14),
                   iVar23 == 0)) && (iVar23 = iVar24, puVar40 + uVar39 == puVar26)) &&
                 (iVar23 = client_do_handle_certificate
                                     (tls,(uint8_t *)local_100,
                                      (uint8_t *)((long)&local_100->type + (long)local_d8)),
                 iVar23 == 0)) {
                ptls__key_schedule_update_hash
                          (tls->key_schedule,(uint8_t *)emitter_00,(size_t)local_e0);
                tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
                iVar23 = 0x202;
              }
            }
          }
          else {
            local_100 = (ptls_raw_extension_t *)0x0;
            iVar23 = 0x2a;
          }
        }
        else {
          local_100 = (ptls_raw_extension_t *)0x0;
        }
        goto LAB_0010bff7;
      }
    }
LAB_0010bb9c:
    local_100 = (ptls_raw_extension_t *)0x0;
LAB_0010bff7:
    free(local_100);
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (cVar3 != '\x0f') {
      return 10;
    }
    iVar23 = handle_certificate_verify(tls,message,"TLS 1.3, server CertificateVerify");
    if (iVar23 != 0) {
      return iVar23;
    }
    tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
LAB_0010bbbd:
    iVar23 = 0x202;
    break;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if (is_end_of_record == 0 || cVar3 != '\x14') {
      return 10;
    }
    iVar23 = verify_finished(tls,message);
    if (iVar23 == 0) {
      ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar28);
      iVar23 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      if (((iVar23 == 0) &&
          (iVar23 = setup_traffic_protection(tls,0,"s ap traffic",3,0), iVar23 == 0)) &&
         ((iVar23 = derive_secret(tls->key_schedule,&sh,"c ap traffic"), iVar23 == 0 &&
          (iVar23 = derive_exporter_secret(tls,0), iVar23 == 0)))) {
        if (tls->pending_handshake_secret == (uint8_t *)0x0) {
LAB_0010c6d9:
          iVar23 = push_change_cipher_spec(tls,emitter);
          if (iVar23 == 0) {
            puVar28 = (tls->field_18).client.certificate_request.context.base;
            if (puVar28 == (uint8_t *)0x0) {
LAB_0010c75e:
              send_finished(tls,emitter);
              *(undefined8 *)(tls->traffic_protection).enc.secret = sh.random_._0_8_;
              *(undefined8 *)((tls->traffic_protection).enc.secret + 8) = sh.random_._8_8_;
              *(undefined8 *)((tls->traffic_protection).enc.secret + 0x10) = sh.random_._16_8_;
              *(undefined8 *)((tls->traffic_protection).enc.secret + 0x18) = sh.random_._24_8_;
              *(uint8_t **)((tls->traffic_protection).enc.secret + 0x20) = sh.legacy_session_id.base
              ;
              *(size_t *)((tls->traffic_protection).enc.secret + 0x28) = sh.legacy_session_id.len;
              *(undefined8 *)((tls->traffic_protection).enc.secret + 0x30) = sh._48_8_;
              *(uint8_t **)((tls->traffic_protection).enc.secret + 0x38) = sh.field_3.peerkey.base;
              iVar23 = setup_traffic_protection(tls,1,(char *)0x0,3,0);
              if (iVar23 == 0) {
                tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
                iVar23 = 0;
              }
            }
            else if ((tls->field_0x160 & 2) == 0) {
              context.len = (tls->field_18).client.certificate_request.context.len;
              context.base = puVar28;
              iVar23 = send_certificate_and_certificate_verify
                                 (tls,emitter,
                                  &(tls->field_18).client.certificate_request.signature_algorithms,
                                  context,"TLS 1.3, client CertificateVerify",0,(uint16_t *)0x0,0);
              free((tls->field_18).client.certificate_request.context.base);
              (tls->field_18).client.certificate_request.context.base = (uint8_t *)0x0;
              (tls->field_18).client.certificate_request.context.len = 0;
              if (iVar23 == 0) goto LAB_0010c75e;
            }
            else {
              iVar23 = 0x2f;
            }
          }
        }
        else {
          if (((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) &&
             (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0)) {
            __assert_fail("tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                          ,0xb84,
                          "int client_handle_finished(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t)"
                         );
          }
          bVar20 = (tls->field_18).server.pending_traffic_secret[0x38];
          if (((bVar20 & 2) == 0) || ((tls->ctx->field_0x70 & 0x10) != 0)) {
LAB_0010c6c0:
            (tls->field_18).server.pending_traffic_secret[0x38] = bVar20 & 0xfd;
            iVar23 = commission_handshake_secret(tls);
            if (iVar23 == 0) goto LAB_0010c6d9;
          }
          else {
            iVar23 = (*emitter->begin_message)(emitter);
            if (iVar23 == 0) {
              buf = emitter->buf;
              sched = tls->key_schedule;
              sVar8 = buf->off;
              ticket_nonce.base._0_1_ = 5;
              iVar23 = ptls_buffer__do_pushv(buf,&ticket_nonce,1);
              if ((iVar23 == 0) && (iVar23 = ptls_buffer__do_pushv(buf,"",3), iVar23 == 0)) {
                sVar9 = buf->off;
                for (lVar31 = -3; lVar31 != 0; lVar31 = lVar31 + 1) {
                  buf->base[lVar31 + sVar9] = '\0';
                }
                if (sched != (ptls_key_schedule_t *)0x0) {
                  ptls__key_schedule_update_hash(sched,buf->base + sVar8,buf->off - sVar8);
                }
                iVar23 = (*emitter->commit_message)(emitter);
                if (iVar23 == 0) {
                  bVar20 = (tls->field_18).server.pending_traffic_secret[0x38];
                  goto LAB_0010c6c0;
                }
              }
            }
          }
        }
      }
    }
    (*ptls_clear_memory)(&sh,0x40);
    break;
  default:
    goto switchD_0010b3b1_caseD_8;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (cVar3 == '\x18') {
      message_00.base = puVar28;
      iVar23 = handle_key_update(tls,emitter_00,message_00);
      return iVar23;
    }
    if (cVar3 == '\x04') {
      puVar26 = (uint8_t *)((long)&emitter_00->buf + 4);
      iVar23 = decode_new_session_ticket
                         (tls,&ticket_lifetime,&ticket_age_add,&ticket_nonce,(ptls_iovec_t *)&sh,
                          &max_early_data_size,puVar26,
                          (uint8_t *)((long)&emitter_00->buf + (long)puVar28));
      if (iVar23 == 0) {
        if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
          iVar23 = 0;
        }
        else {
          sh.random_._0_8_ = (long)"GET / HTTP/1.0\r\n\r\n" + 0x12;
          sh.random_[8] = '\0';
          sh.random_[9] = '\0';
          sh.random_[10] = '\0';
          sh.random_[0xb] = '\0';
          sh.random_[0xc] = '\0';
          sh.random_[0xd] = '\0';
          sh.random_[0xe] = '\0';
          sh.random_[0xf] = '\0';
          sh.random_[0x10] = '\0';
          sh.random_[0x11] = '\0';
          sh.random_[0x12] = '\0';
          sh.random_[0x13] = '\0';
          sh.random_[0x14] = '\0';
          sh.random_[0x15] = '\0';
          sh.random_[0x16] = '\0';
          sh.random_[0x17] = '\0';
          sh.random_._24_8_ = sh.random_._24_8_ & 0xffffffff00000000;
          psVar5 = tls->ctx->get_time;
          uVar27 = (*psVar5->cb)(psVar5);
          _ticket_lifetime =
               (ushort *)
               (uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28
               | uVar27 << 0x38);
          iVar23 = ptls_buffer__do_pushv((ptls_buffer_t *)&sh,&ticket_lifetime,8);
          if (iVar23 == 0) {
            uVar21 = tls->key_share->id;
            uVar21 = uVar21 << 8 | uVar21 >> 8;
            ticket_age_add._0_1_ = (char)uVar21;
            ticket_age_add._1_1_ = (char)(uVar21 >> 8);
            iVar23 = ptls_buffer__do_pushv((ptls_buffer_t *)&sh,&ticket_age_add,2);
            if (iVar23 == 0) {
              uVar21 = tls->cipher_suite->id;
              max_early_data_size._0_2_ = uVar21 << 8 | uVar21 >> 8;
              iVar23 = ptls_buffer__do_pushv((ptls_buffer_t *)&sh,&max_early_data_size,2);
              if (((iVar23 == 0) &&
                  (iVar23 = ptls_buffer__do_pushv((ptls_buffer_t *)&sh,"",3),
                  uVar17 = sh.random_._16_8_, iVar23 == 0)) &&
                 (iVar23 = ptls_buffer__do_pushv
                                     ((ptls_buffer_t *)&sh,puVar26,(size_t)(puVar28 + -4)),
                 iVar23 == 0)) {
                puVar33 = (undefined1 *)(uVar17 + sh.random_._0_8_ + -3);
                for (lVar31 = 0x10; lVar31 != -8; lVar31 = lVar31 + -8) {
                  *puVar33 = (char)((ulong)(sh.random_._16_8_ - uVar17) >> ((byte)lVar31 & 0x3f));
                  puVar33 = puVar33 + 1;
                }
                iVar23 = ptls_buffer__do_pushv((ptls_buffer_t *)&sh,"",2);
                uVar17 = sh.random_._16_8_;
                if (((iVar23 == 0) &&
                    (iVar23 = ptls_buffer_reserve((ptls_buffer_t *)&sh,
                                                  (tls->key_schedule->hashes[0].algo)->digest_size),
                    uVar18 = sh.random_._16_8_, uVar16 = sh.random_._0_8_, iVar23 == 0)) &&
                   (nonce.base._1_7_ = ticket_nonce.base._1_7_,
                   nonce.base._0_1_ = ticket_nonce.base._0_1_, nonce.len = ticket_nonce.len,
                   iVar23 = derive_resumption_secret
                                      (tls->key_schedule,
                                       (uint8_t *)(sh.random_._0_8_ + sh.random_._16_8_),nonce),
                   iVar23 == 0)) {
                  sh.random_._16_8_ = uVar18 + (tls->key_schedule->hashes[0].algo)->digest_size;
                  *(char *)(uVar16 + -2 + uVar17) = (char)((ulong)(sh.random_._16_8_ - uVar17) >> 8)
                  ;
                  *(char *)(uVar16 + -1 + uVar17) = (char)(sh.random_._16_8_ - uVar17);
                  psVar12 = tls->ctx->save_ticket;
                  pVar47.len = sh.random_._16_8_;
                  pVar47.base = (uint8_t *)uVar16;
                  iVar23 = (*psVar12->cb)(psVar12,tls,pVar47);
                }
              }
            }
          }
          ptls_buffer_dispose((ptls_buffer_t *)&sh);
        }
      }
    }
  }
  return iVar23;
LAB_0010c17a:
  iVar23 = 0x2f;
LAB_0010c1fd:
  if (local_100 == (ptls_raw_extension_t *)client_handle_encrypted_extensions_no_unknown_extensions)
  {
    return iVar23;
  }
  goto LAB_0010bff7;
}

Assistant:

static int handle_client_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO && is_end_of_record) {
            ret = client_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST) {
            ret = client_handle_certificate_request(tls, message, properties);
            break;
        }
    /* fall through */
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_CERTIFICATE:
            ret = client_handle_certificate(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_COMPRESSED_CERTIFICATE:
            ret = client_handle_compressed_certificate(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = client_handle_finished(tls, emitter, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);

    return ret;
}